

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::Interpreter::UpdateNetworkSelectionInfo
          (Error *__return_storage_ptr__,Interpreter *this,bool onStart)

{
  char cVar1;
  Status SVar2;
  char *pcVar3;
  char *pcVar4;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  writer write;
  char *pcStack_108;
  undefined1 local_f0 [40];
  Network nwk;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  persistent_storage::Network::Network(&nwk);
  SVar2 = persistent_storage::Registry::GetCurrentNetwork
                    ((this->mRegistry).
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&nwk);
  if (SVar2 == kSuccess) {
    if ((!onStart) || (nwk.mXpan == 0)) goto LAB_0012548b;
    local_68.types_[0] = string_type;
    local_68.types_[1] = string_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "Network selection recalled from previous session.\nRestored to [{}:\'{}\']";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x47;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    local_68.parse_funcs_[1] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "Network selection recalled from previous session.\nRestored to [{}:\'{}\']";
    write.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar3,"");
          goto LAB_00125427;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                         (pcVar4,"",&local_68);
    }
LAB_00125427:
    utils::Hex<unsigned_long>((string *)&write,nwk.mXpan);
    local_68.types_ = (type  [2])write.handler_;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = pcStack_108;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
         (size_t)nwk.mName._M_dataplus._M_p;
    local_68.context_.super_basic_format_parse_context<char>._16_8_ = nwk.mName._M_string_length;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x47;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_f0,
               (v10 *)"Network selection recalled from previous session.\nRestored to [{}:\'{}\']",
               fmt,args_00);
    Console::Write((string *)local_f0,kGreen);
    this_00 = (string *)local_f0;
  }
  else {
    local_68.types_ = (type  [2])((ulong)local_68.types_ & 0xffffffff00000000);
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "getting current network failed";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_68.context_.super_basic_format_parse_context<char>._16_8_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "getting current network failed";
    local_68.context_.types_ = local_68.types_;
    while (pcVar4 = pcVar3, pcVar4 != "") {
      pcVar3 = pcVar4 + 1;
      if (*pcVar4 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar4 + 2;
      }
      else if (*pcVar4 == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",(format_string_checker<char> *)&local_68);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&write,(v10 *)"getting current network failed",(string_view)ZEXT816(0x1e),
               args);
    this_00 = (string *)(local_f0 + 8);
    local_f0._0_4_ = kRegistryError;
    std::__cxx11::string::string(this_00,(string *)&write);
    Error::operator=(__return_storage_ptr__,(Error *)local_f0);
  }
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string((string *)&write);
LAB_0012548b:
  Console::SetPrompt(&nwk.mName);
  persistent_storage::Network::~Network(&nwk);
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::UpdateNetworkSelectionInfo(bool onStart /*=false*/)
{
    Error   error;
    Network nwk;

    VerifyOrExit(mRegistry->GetCurrentNetwork(nwk) == Registry::Status::kSuccess,
                 error = ERROR_REGISTRY_ERROR(RUNTIME_CUR_NETWORK_FAILED));
    if (onStart && nwk.mXpan != 0)
    {
        Console::Write(fmt::format(FMT_STRING("Network selection recalled from previous session.\n"
                                              "Restored to [{}:'{}']"),
                                   utils::Hex(nwk.mXpan), nwk.mName),
                       Console::Color::kGreen);
    }
exit:
    Console::SetPrompt(nwk.mName);
    return error;
}